

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O2

bool __thiscall
cmCursesBoolWidget::HandleInput
          (cmCursesBoolWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  bool bVar1;
  ulong uVar2;
  
  if ((*key == 0x157) || (*key == 10)) {
    bVar1 = GetValueAsBool(this);
    SetValueAsBool(this,!bVar1);
    if (w == (WINDOW *)0x0) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      uVar2 = (ulong)((int)w->_maxy + 1);
    }
    wtouchln(w,0,uVar2,1);
    wrefresh(w);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmCursesBoolWidget::HandleInput(int& key, cmCursesMainForm*, WINDOW* w)
{

  // 10 == enter
  if (key == 10 || key == KEY_ENTER)
    {
    if (this->GetValueAsBool())
      {
      this->SetValueAsBool(false);
      }
    else
      {
      this->SetValueAsBool(true);
      }

    touchwin(w);
    wrefresh(w);
    return true;
    }
  else
    {
    return false;
    }

}